

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

bool ObjectTempVerify::IsTempTransfer(Instr *instr)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *this;
  bool local_1b;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  Instr *local_18;
  Instr *instr_local;
  
  local_18 = instr;
  bVar1 = ObjectTemp::IsTempTransfer(instr);
  if (((bVar1) || (local_18->m_opcode == Ld_I4)) || (local_18->m_opcode == LdC_A_I4)) {
    local_1b = false;
    if ((*(ushort *)&local_18->field_0x36 >> 3 & 1) == 0) {
      pOVar2 = IR::Instr::GetDst(local_18);
      local_1b = false;
      if (pOVar2 != (Opnd *)0x0) {
        pOVar2 = IR::Instr::GetDst(local_18);
        bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
        local_1b = false;
        if (bVar1) {
          pOVar2 = IR::Instr::GetDst(local_18);
          this = IR::Opnd::AsRegOpnd(pOVar2);
          local_1a.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(&this->super_Opnd);
          local_1b = ValueType::IsNotObject((ValueType *)&local_1a.field_0);
        }
      }
    }
    if (local_1b == false) {
      instr_local._7_1_ = true;
    }
    else {
      instr_local._7_1_ = false;
    }
  }
  else {
    instr_local._7_1_ = false;
  }
  return instr_local._7_1_;
}

Assistant:

bool
ObjectTempVerify::IsTempTransfer(IR::Instr * instr)
{
    if (ObjectTemp::IsTempTransfer(instr)
        // Add the Ld_I4, and LdC_A_I4 as the forward pass might have changed Ld_A to these
        || instr->m_opcode == Js::OpCode::Ld_I4
        || instr->m_opcode == Js::OpCode::LdC_A_I4)
    {
        if (!instr->dstIsTempObject && instr->GetDst() && instr->GetDst()->IsRegOpnd()
          && instr->GetDst()->AsRegOpnd()->GetValueType().IsNotObject())
        {
            // Globopt has proved that dst is not an object, so this is not really an object transfer.
            // This prevents the case where glob opt turned a Conv_Num to Ld_A and expose additional
            // transfer.
            return false;
        }
        return true;
    }
    return false;
}